

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

bool __thiscall AggressiveBotStrategy::canFortify(AggressiveBotStrategy *this)

{
  Country *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar5;
  reference ppCVar6;
  Country *neighbour;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range1_1;
  Country *country;
  iterator __end1;
  iterator __begin1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range1;
  Country *biggestCountry;
  bool canFortify;
  AggressiveBotStrategy *this_local;
  
  biggestCountry._7_1_ = false;
  __range1 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0;
  pvVar5 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
  __end1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar5);
  country = (Country *)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar5);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                *)&country);
    if (!bVar2) {
      pvVar5 = Map::Country::getAdjCountries((Country *)__range1);
      __end1_1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar5);
      neighbour = (Country *)
                  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar5);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                            *)&neighbour);
        if (!bVar2) break;
        ppCVar6 = __gnu_cxx::
                  __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                  ::operator*(&__end1_1);
        pCVar1 = *ppCVar6;
        iVar3 = Map::Country::getPlayerOwnerID(pCVar1);
        iVar4 = Map::Country::getPlayerOwnerID((Country *)__range1);
        if (iVar3 == iVar4) {
          iVar3 = Map::Country::getNumberOfTroops(pCVar1);
          if (1 < iVar3) {
            biggestCountry._7_1_ = true;
          }
        }
        __gnu_cxx::
        __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
        ::operator++(&__end1_1);
      }
      return biggestCountry._7_1_;
    }
    ppCVar6 = __gnu_cxx::
              __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
              ::operator*(&__end1);
    pCVar1 = *ppCVar6;
    if (__range1 == (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0) {
LAB_0010c0eb:
      __range1 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)pCVar1;
    }
    else {
      iVar3 = Map::Country::getNumberOfTroops((Country *)__range1);
      iVar4 = Map::Country::getNumberOfTroops(pCVar1);
      if (iVar3 < iVar4) goto LAB_0010c0eb;
    }
    __gnu_cxx::
    __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool AggressiveBotStrategy::canFortify() {
    bool canFortify = false;
    Map::Country* biggestCountry = nullptr;
    for (auto* country: *player->getOwnedCountries()) {
        if (biggestCountry == nullptr || biggestCountry->getNumberOfTroops() < country->getNumberOfTroops()) {
            biggestCountry = country;
        }
    }
    for (auto* neighbour : *biggestCountry->getAdjCountries()) {
        if (neighbour->getPlayerOwnerID() == biggestCountry->getPlayerOwnerID() && neighbour->getNumberOfTroops() > 1) {
            canFortify = true;
        }
    }
    return canFortify;
}